

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  size_type __n;
  size_t sVar1;
  bool bVar2;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *this_00;
  vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_> *this_01;
  size_type sVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap_00;
  reference puVar4;
  reference pvVar5;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_02;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_03;
  cmListFileBacktrace *__args_3;
  bool local_152;
  bool local_151;
  value_type local_150;
  size_t dependee_component_head;
  size_t dependee_component;
  cmGraphEdge *ni_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  EdgeList *__range2_1;
  EdgeList *nl_1;
  size_t depender_component_tail;
  size_t depender_component;
  size_t n;
  undefined1 local_f8 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> visited;
  size_t ni;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __end2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  __begin2;
  cmGraphNodeList local_a0;
  cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *__range2;
  NodeList *nl;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> emitted;
  size_t head;
  size_t c;
  size_t nc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *cmap;
  Graph *cgraph;
  vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_> *components;
  cmComputeComponentGraph *ccg_local;
  cmComputeTargetDepends *this_local;
  
  this_00 = cmComputeComponentGraph::GetComponents(ccg);
  this_01 = &cmComputeComponentGraph::GetComponentGraph(ccg)->
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                    (&(this->InitialGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->FinalGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             sVar3);
  cmap_00 = cmComputeComponentGraph::GetComponentMap(ccg);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->ComponentHead,sVar3);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->ComponentTail,sVar3);
  sVar3 = std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::size(this_00);
  for (head = 0; head < sVar3; head = head + 1) {
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0xffffffffffffffff;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&nl);
    __range2 = (cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                *)std::vector<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>::operator[]
                            (this_00,head);
    cmReverseRange<cmGraphNodeList>(&local_a0);
    local_a0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_a0;
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::begin((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             *)&__end2);
    cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::end((cmRange<std::reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           *)&ni);
    while (bVar2 = std::operator!=(&__end2,(reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                            *)&ni),
          sVar1 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count, bVar2) {
      puVar4 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator*(&__end2);
      visited._M_t._M_impl.super__Rb_tree_header._M_node_count = *puVar4;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_f8);
      bVar2 = IntraComponent(this,cmap_00,head,
                             visited._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)&nl,(set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)local_f8);
      if (!bVar2) {
        ComplainAboutBadComponent(this,ccg,head,true);
        this_local._7_1_ = 0;
      }
      bVar2 = !bVar2;
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 local_f8);
      if (bVar2) goto LAB_00a5d586;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::operator++(&__end2);
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->ComponentHead,head);
    *pvVar5 = sVar1;
    bVar2 = false;
LAB_00a5d586:
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)&nl);
    if (bVar2) goto LAB_00a5d76c;
  }
  sVar3 = std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size(this_01);
  for (depender_component_tail = 0; depender_component_tail < sVar3;
      depender_component_tail = depender_component_tail + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->ComponentTail,depender_component_tail);
    __n = *pvVar5;
    this_02 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (this_01,depender_component_tail)->
               super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    __end2_1 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_02);
    ni_1 = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_02);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                               *)&ni_1), bVar2) {
      dependee_component =
           (size_t)__gnu_cxx::
                   __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                   ::operator*(&__end2_1);
      dependee_component_head =
           cmGraphEdge::operator_cast_to_unsigned_long((cmGraphEdge *)dependee_component);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->ComponentHead,dependee_component_head);
      local_150 = *pvVar5;
      this_03 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                          (&(this->FinalGraph).
                            super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,__n);
      local_151 = cmGraphEdge::IsStrong((cmGraphEdge *)dependee_component);
      local_152 = cmGraphEdge::IsCross((cmGraphEdge *)dependee_component);
      __args_3 = cmGraphEdge::GetBacktrace((cmGraphEdge *)dependee_component);
      std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
      emplace_back<unsigned_long&,bool,bool,cmListFileBacktrace_const&>
                (this_03,&local_150,&local_151,&local_152,__args_3);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2_1);
    }
  }
  this_local._7_1_ = 1;
LAB_00a5d76c:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<size_t> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  size_t nc = components.size();
  for (size_t c = 0; c < nc; ++c) {
    size_t head = cmComputeComponentGraph::INVALID_COMPONENT;
    std::set<size_t> emitted;
    NodeList const& nl = components[c];
    for (size_t ni : cmReverseRange(nl)) {
      std::set<size_t> visited;
      if (!this->IntraComponent(cmap, c, ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  size_t n = cgraph.size();
  for (size_t depender_component = 0; depender_component < n;
       ++depender_component) {
    size_t depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_component = ni;
      size_t dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].emplace_back(
        dependee_component_head, ni.IsStrong(), ni.IsCross(),
        ni.GetBacktrace());
    }
  }
  return true;
}